

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void __thiscall
TPZFMatrix<Fad<float>_>::TimesBetaPlusZ
          (TPZFMatrix<Fad<float>_> *this,Fad<float> *beta,TPZFMatrix<Fad<float>_> *z)

{
  Fad<float> *pFVar1;
  Fad<float> *this_00;
  Fad<float> *x;
  
  this_00 = this->fElem;
  pFVar1 = this_00 + (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol *
                     (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
  x = z->fElem;
  for (; this_00 < pFVar1; this_00 = this_00 + 1) {
    Fad<float>::operator*=<float,_nullptr>(this_00,beta);
    Fad<float>::operator+=<float,_nullptr>(this_00,x);
    x = x + 1;
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::TimesBetaPlusZ(const TVar beta,const TPZFMatrix<TVar> &z) {
    // #ifdef USING_ATLAS
    // 	int size = fRow*fCol;
    // 	cblas_dscal(size,beta,fElem,1);
    // 	cblas_daxpy(size,1.,z.fElem,1,fElem,1);
    // #else
    
    TVar * pt = fElem,  *ptlast = fElem + this->fRow*this->fCol;
    TVar * pz = z.fElem;
    //	while(pt < ptlast) *pt++ *= (beta) + *pz++;
    while(pt < ptlast) {
        *pt *= (beta);
        *pt++ += *pz++;
    }
    // #endif
}